

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ontrak.cpp
# Opt level: O0

int CheckDevicesState(void)

{
  int iVar1;
  int local_10 [2];
  int bON;
  
  local_10[0] = 0;
  iVar1 = GetDeviceCurrentState("CurArmadeusState.txt",local_10);
  if (iVar1 != 0) {
    return 1;
  }
  if (local_10[0] != bArmadeusON) {
    if (local_10[0] == 0) {
      iVar1 = SetRelayOntrak(&ontrak,0,0);
      if (iVar1 != 0) {
        return 1;
      }
      printf("Armadeus : OFF.\n");
      fflush(_stdout);
    }
    else {
      iVar1 = SetRelayOntrak(&ontrak,0,1);
      if (iVar1 != 0) {
        return 1;
      }
      printf("Armadeus : ON.\n");
      fflush(_stdout);
    }
    bArmadeusON = local_10[0];
  }
  iVar1 = GetDeviceCurrentState("CurBottomPumpState.txt",local_10);
  if (iVar1 != 0) {
    return 1;
  }
  if (local_10[0] != bBottomPumpON) {
    if (local_10[0] == 0) {
      iVar1 = SetRelayOntrak(&ontrak,1,1);
      if (iVar1 != 0) {
        return 1;
      }
      printf("Bottom pump : OFF.\n");
      fflush(_stdout);
    }
    else {
      iVar1 = SetRelayOntrak(&ontrak,1,0);
      if (iVar1 != 0) {
        return 1;
      }
      printf("Bottom pump : ON.\n");
      fflush(_stdout);
    }
    bBottomPumpON = local_10[0];
  }
  iVar1 = GetDeviceCurrentState("CurSurfacePumpState.txt",local_10);
  if (iVar1 != 0) {
    return 1;
  }
  if (local_10[0] != bSurfacePumpON) {
    if (local_10[0] == 0) {
      iVar1 = SetRelayOntrak(&ontrak,2,1);
      if (iVar1 != 0) {
        return 1;
      }
      printf("Surface pump : OFF.\n");
      fflush(_stdout);
    }
    else {
      iVar1 = SetRelayOntrak(&ontrak,2,0);
      if (iVar1 != 0) {
        return 1;
      }
      printf("Surface pump : ON.\n");
      fflush(_stdout);
    }
    bSurfacePumpON = local_10[0];
  }
  iVar1 = GetDeviceCurrentState("CurProbeState.txt",local_10);
  if (iVar1 != 0) {
    return 1;
  }
  if (local_10[0] != bProbeON) {
    if (local_10[0] == 0) {
      iVar1 = SetRelayOntrak(&ontrak,4,1);
      if (iVar1 != 0) {
        return 1;
      }
      printf("Probe : OFF.\n");
      fflush(_stdout);
    }
    else {
      iVar1 = SetRelayOntrak(&ontrak,4,0);
      if (iVar1 != 0) {
        return 1;
      }
      printf("Probe : ON.\n");
      fflush(_stdout);
    }
    bProbeON = local_10[0];
  }
  iVar1 = GetDeviceCurrentState("CurWifiState.txt",local_10);
  if (iVar1 == 0) {
    if (local_10[0] != bWifiON) {
      if (local_10[0] == 0) {
        iVar1 = SetRelayOntrak(&ontrak,3,0);
        if (iVar1 != 0) {
          return 1;
        }
        printf("Wi-Fi : OFF.\n");
        fflush(_stdout);
      }
      else {
        iVar1 = SetRelayOntrak(&ontrak,3,1);
        if (iVar1 != 0) {
          return 1;
        }
        printf("Wi-Fi : ON.\n");
        fflush(_stdout);
      }
      bWifiON = local_10[0];
    }
    iVar1 = GetDeviceCurrentState("CurIridiumState.txt",local_10);
    if (iVar1 != 0) {
      return 1;
    }
    if (local_10[0] != bIridiumON) {
      if (local_10[0] == 0) {
        iVar1 = SetDigitalRelayOntrak(&ontrak,6,1);
        if (iVar1 != 0) {
          return 1;
        }
        printf("Iridium : OFF.\n");
        fflush(_stdout);
      }
      else {
        iVar1 = SetDigitalRelayOntrak(&ontrak,6,0);
        if (iVar1 != 0) {
          return 1;
        }
        printf("Iridium : ON.\n");
        fflush(_stdout);
      }
      bIridiumON = local_10[0];
    }
    iVar1 = GetDeviceCurrentState("CurSailMotorState.txt",local_10);
    if (iVar1 == 0) {
      if (local_10[0] != bSailMotorON) {
        if (local_10[0] == 0) {
          iVar1 = SetDigitalRelayOntrak(&ontrak,7,1);
          if (iVar1 != 0) {
            return 1;
          }
          printf("Sail motor : OFF.\n");
          fflush(_stdout);
        }
        else {
          iVar1 = SetDigitalRelayOntrak(&ontrak,7,0);
          if (iVar1 != 0) {
            return 1;
          }
          printf("Sail motor : ON.\n");
          fflush(_stdout);
        }
        bSailMotorON = local_10[0];
      }
      return 0;
    }
    return 1;
  }
  return 1;
}

Assistant:

int CheckDevicesState(void)
{
	int bON = 0;

	if (GetDeviceCurrentState("CurArmadeusState.txt", &bON) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}
	if (bON != bArmadeusON)
	{
		// Active-low.
		if (bON)
		{
			if (SetRelayOntrak(&ontrak, ARMADEUS_CHANNEL_ONTRAK, 1) != EXIT_SUCCESS)
			{
				return EXIT_FAILURE;
			}
			printf("Armadeus : ON.\n"); fflush(stdout);
		}
		else
		{
			if (SetRelayOntrak(&ontrak, ARMADEUS_CHANNEL_ONTRAK, 0) != EXIT_SUCCESS)
			{
				return EXIT_FAILURE;
			}
			printf("Armadeus : OFF.\n"); fflush(stdout);
		}
		bArmadeusON = bON;
	}

	if (GetDeviceCurrentState("CurBottomPumpState.txt", &bON) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}
	if (bON != bBottomPumpON)
	{
		if (bON)
		{
			if (SetRelayOntrak(&ontrak, BOTTOM_PUMP_CHANNEL_ONTRAK, 0) != EXIT_SUCCESS)
			{
				return EXIT_FAILURE;
			}
			printf("Bottom pump : ON.\n"); fflush(stdout);
		}
		else
		{
			if (SetRelayOntrak(&ontrak, BOTTOM_PUMP_CHANNEL_ONTRAK, 1) != EXIT_SUCCESS)
			{
				return EXIT_FAILURE;
			}
			printf("Bottom pump : OFF.\n"); fflush(stdout);
		}
		bBottomPumpON = bON;
	}

	if (GetDeviceCurrentState("CurSurfacePumpState.txt", &bON) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}
	if (bON != bSurfacePumpON)
	{
		if (bON)
		{
			if (SetRelayOntrak(&ontrak, SURFACE_PUMP_CHANNEL_ONTRAK, 0) != EXIT_SUCCESS)
			{
				return EXIT_FAILURE;
			}
			printf("Surface pump : ON.\n"); fflush(stdout);
		}
		else
		{
			if (SetRelayOntrak(&ontrak, SURFACE_PUMP_CHANNEL_ONTRAK, 1) != EXIT_SUCCESS)
			{
				return EXIT_FAILURE;
			}
			printf("Surface pump : OFF.\n"); fflush(stdout);
		}
		bSurfacePumpON = bON;
	}

	if (GetDeviceCurrentState("CurProbeState.txt", &bON) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}
	if (bON != bProbeON)
	{
		if (bON)
		{
			if (SetRelayOntrak(&ontrak, PROBE_CHANNEL_ONTRAK, 0) != EXIT_SUCCESS)
			{
				return EXIT_FAILURE;
			}
			printf("Probe : ON.\n"); fflush(stdout);
		}
		else
		{
			if (SetRelayOntrak(&ontrak, PROBE_CHANNEL_ONTRAK, 1) != EXIT_SUCCESS)
			{
				return EXIT_FAILURE;
			}
			printf("Probe : OFF.\n"); fflush(stdout);
		}
		bProbeON = bON;
	}

	if (GetDeviceCurrentState("CurWifiState.txt", &bON) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}
	if (bON != bWifiON)
	{
		// Active-low.
		if (bON)
		{
			if (SetRelayOntrak(&ontrak, WIFI_CHANNEL_ONTRAK, 1) != EXIT_SUCCESS)
			{
				return EXIT_FAILURE;
			}
			printf("Wi-Fi : ON.\n"); fflush(stdout);
		}
		else
		{
			if (SetRelayOntrak(&ontrak, WIFI_CHANNEL_ONTRAK, 0) != EXIT_SUCCESS)
			{
				return EXIT_FAILURE;
			}
			printf("Wi-Fi : OFF.\n"); fflush(stdout);
		}
		bWifiON = bON;
	}

	if (GetDeviceCurrentState("CurIridiumState.txt", &bON) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}
	if (bON != bIridiumON)
	{
		if (bON)
		{
			if (SetDigitalRelayOntrak(&ontrak, IRIDIUM_CHANNEL_ONTRAK, 0) != EXIT_SUCCESS)
			{
				return EXIT_FAILURE;
			}
			printf("Iridium : ON.\n"); fflush(stdout);
		}
		else
		{
			if (SetDigitalRelayOntrak(&ontrak, IRIDIUM_CHANNEL_ONTRAK, 1) != EXIT_SUCCESS)
			{
				return EXIT_FAILURE;
			}
			printf("Iridium : OFF.\n"); fflush(stdout);
		}
		bIridiumON = bON;
	}

	if (GetDeviceCurrentState("CurSailMotorState.txt", &bON) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}
	if (bON != bSailMotorON)
	{
		if (bON)
		{
			if (SetDigitalRelayOntrak(&ontrak, SAIL_MOTOR_CHANNEL_ONTRAK, 0) != EXIT_SUCCESS)
			{
				return EXIT_FAILURE;
			}
			printf("Sail motor : ON.\n"); fflush(stdout);
		}
		else
		{
			if (SetDigitalRelayOntrak(&ontrak, SAIL_MOTOR_CHANNEL_ONTRAK, 1) != EXIT_SUCCESS)
			{
				return EXIT_FAILURE;
			}
			printf("Sail motor : OFF.\n"); fflush(stdout);
		}
		bSailMotorON = bON;
	}

	return EXIT_SUCCESS;
}